

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_helpers.c
# Opt level: O0

int kvtree_unpack_uint16_t(void *buf,size_t buf_size,size_t *buf_pos,uint16_t *val)

{
  __uint16_t _Var1;
  ulong uVar2;
  uint16_t val_network;
  size_t pos_final;
  size_t pos;
  uint16_t *val_local;
  size_t *buf_pos_local;
  size_t buf_size_local;
  void *buf_local;
  
  if (((buf == (void *)0x0) || (buf_pos == (size_t *)0x0)) || (val == (uint16_t *)0x0)) {
    kvtree_err("NULL pointer to buffer, buffer position, or value @ %s:%d",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
               ,0xd5);
    buf_local._4_4_ = 1;
  }
  else {
    uVar2 = *buf_pos + 2;
    if (buf_size < uVar2) {
      kvtree_err("Attempting to unpack too many bytes into buffer @ %s:%d",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_helpers.c"
                 ,0xe3);
      buf_local._4_4_ = 1;
    }
    else {
      _Var1 = __bswap_16(*(__uint16_t *)((long)buf + *buf_pos));
      *val = _Var1;
      *buf_pos = uVar2;
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int kvtree_unpack_uint16_t(const void* buf, size_t buf_size, size_t* buf_pos, uint16_t* val)
{
  /* check that we have a valid pointer to a buffer position value */
  if (buf == NULL || buf_pos == NULL || val == NULL) {
    kvtree_err("NULL pointer to buffer, buffer position, or value @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* get current buffer position */
  size_t pos = *buf_pos;

  /* compute final buffer position */
  size_t pos_final = pos + sizeof(uint16_t);

  /* check that we won't overrun the buffer */
  if (pos_final > buf_size) {
    kvtree_err("Attempting to unpack too many bytes into buffer @ %s:%d",
            __FILE__, __LINE__
    );
    return KVTREE_FAILURE;
  }

  /* read value from buffer (stored in network order) */
  uint16_t val_network;
  memcpy(&val_network, buf + pos, sizeof(val_network));

  /* conver to host order */
  *val = kvtree_ntoh16(val_network);

  /* update position */
  *buf_pos = pos_final;

  return KVTREE_SUCCESS;
}